

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test::
~SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test
          (SDLGraphicsSystemWithLoadedTexture_renderTextureInFullWindowSuccessfully_Test *this)

{
  SDLGraphicsSystemTests::~SDLGraphicsSystemTests((SDLGraphicsSystemTests *)this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       renderTextureInFullWindowSuccessfully)
{
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   Eq(std::nullopt), Eq(std::nullopt))
    ).WillOnce(Return(success));

    system.renderTextureInFullWindow(textureId0);
    expectQuitSystemWithLoadedTexture();
}